

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::LogFreePartiallyDecommittedPageSegment
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pageSegment)

{
  size_t *psVar1;
  uint uVar2;
  size_t sVar3;
  PageMemoryData *pPVar4;
  
  uVar2 = pageSegment->decommitPageCount;
  this->committedBytes = this->committedBytes + (ulong)(uVar2 << 0xc);
  if (this->memoryData != (PageMemoryData *)0x0) {
    psVar1 = &this->memoryData->currentCommittedPageCount;
    *psVar1 = *psVar1 + (ulong)uVar2;
    LogFreeSegment(this,&pageSegment->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
    return;
  }
  sVar3 = (pageSegment->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount;
  this->committedBytes = this->committedBytes + sVar3 * -0x1000;
  this->reservedBytes = this->reservedBytes + sVar3 * -0x1000;
  this->numberOfSegments = this->numberOfSegments - 1;
  pPVar4 = this->memoryData;
  if (pPVar4 != (PageMemoryData *)0x0) {
    pPVar4->releaseSegmentCount = pPVar4->releaseSegmentCount + 1;
    pPVar4->releaseSegmentBytes = pPVar4->releaseSegmentBytes + sVar3 * 0x1000;
    pPVar4->currentCommittedPageCount = pPVar4->currentCommittedPageCount - sVar3;
  }
  return;
}

Assistant:

uint GetDecommitPageCount() const { return decommitPageCount; }